

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  uint uVar1;
  int number;
  bool packed;
  CppType CVar2;
  Type TVar3;
  uint32 uVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  void *pvVar7;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(int *)(field + 0x3c) != 3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x892);
    pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=(&local_69,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != cpp_type) {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (cpp_type != CPPTYPE_INT32 || CVar2 != CPPTYPE_ENUM) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x895);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32): "
                         );
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"the actual field type (for enums T should be the generated enum ")
      ;
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"type or int32).");
      internal::LogFinisher::operator=(&local_69,pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  if (message_type != (Descriptor *)0x0) {
    pDVar6 = FieldDescriptor::message_type(field);
    if (pDVar6 != message_type) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x89a);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (message_type) == (field->message_type()): ");
      internal::LogFinisher::operator=(&local_69,pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    TVar3 = FieldDescriptor::type(field);
    packed = FieldDescriptor::is_packed(field);
    pvVar7 = internal::ExtensionSet::MutableRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
                        number,(FieldType)TVar3,packed,field);
  }
  else {
    uVar4 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    pvVar7 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  }
  return pvVar7;
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != nullptr) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}